

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::matrix
          (QControlledGate2<std::complex<double>_> *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined8 in_RCX;
  data_type extraout_RDX_00;
  long *in_RSI;
  undefined8 uVar4;
  undefined8 in_R8;
  data_type *this_00;
  SquareMatrix<std::complex<double>_> SVar5;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m01;
  complex<double> m01_00;
  SquareMatrix<std::complex<double>_> in_stack_ffffffffffffff58;
  matrix_type CG;
  matrix_type E1;
  matrix_type E0;
  matrix_type I2;
  SquareMatrix<std::complex<double>_> local_58;
  SquareMatrix<std::complex<double>_> local_48;
  SquareMatrix<std::complex<double>_> local_38;
  SquareMatrix<std::complex<double>_> local_28;
  undefined8 extraout_RDX;
  
  uVar4 = 2;
  SVar5 = dense::eye<std::complex<double>>((int64_t)&I2);
  m00._M_value._8_8_ =
       SVar5.data_._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  m00._M_value._0_8_ = uVar4;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&E0,m00,m01,(complex<double>)in_stack_ffffffffffffff58,(complex<double>)CG);
  m00_00._M_value._8_8_ = extraout_RDX;
  m00_00._M_value._0_8_ = uVar4;
  m01_00._M_value._8_8_ = in_R8;
  m01_00._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&E1,m00_00,m01_00,(complex<double>)in_stack_ffffffffffffff58,(complex<double>)CG);
  plVar3 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar3 + 0x38))(&CG,plVar3);
  lVar1 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<std::complex<double>>((dense *)&local_28,&E0,&CG);
      dense::kron<std::complex<double>>((dense *)&stack0xffffffffffffff58,&E1,&I2);
      dense::operator+((dense *)this,&local_28,
                       (SquareMatrix<std::complex<double>_> *)&stack0xffffffffffffff58);
      this_00 = &local_28.data_;
    }
    else {
      dense::kron<std::complex<double>>((dense *)&local_38,&CG,&E0);
      dense::kron<std::complex<double>>((dense *)&stack0xffffffffffffff58,&I2,&E1);
      dense::operator+((dense *)this,&local_38,
                       (SquareMatrix<std::complex<double>_> *)&stack0xffffffffffffff58);
      this_00 = &local_38.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<std::complex<double>>((dense *)&local_48,&E0,&I2);
      dense::kron<std::complex<double>>((dense *)&stack0xffffffffffffff58,&E1,&CG);
      dense::operator+((dense *)this,&local_48,
                       (SquareMatrix<std::complex<double>_> *)&stack0xffffffffffffff58);
      this_00 = &local_48.data_;
    }
    else {
      dense::kron<std::complex<double>>((dense *)&local_58,&I2,&E0);
      dense::kron<std::complex<double>>((dense *)&stack0xffffffffffffff58,&CG,&E1);
      dense::operator+((dense *)this,&local_58,
                       (SquareMatrix<std::complex<double>_> *)&stack0xffffffffffffff58);
      this_00 = &local_58.data_;
    }
  }
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &stack0xffffffffffffff60);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (this_00);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&CG.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&E1.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&E0.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I2.data_);
  SVar5.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_00._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar5.size_ = (size_type_conflict)this;
  return SVar5;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }